

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (Option *this,vector<double,_std::allocator<double>_> *target,string_view name,
          string_view value)

{
  string_view value_00;
  string_view value_01;
  string_view name_00;
  bool bVar1;
  undefined1 uVar2;
  size_t sVar3;
  reference pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_RSI;
  string *in_RDI;
  optional<double> oVar5;
  optional<double> result;
  basic_string_view<char,_std::char_traits<char>_> entry;
  iterator __end1;
  iterator __begin1;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *__range1;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> splitMem;
  string *error;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  _Storage<double,_true> in_stack_fffffffffffffea0;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *splitMem_00;
  bitmask<slang::CommandLineFlags> *this_00;
  string *in_stack_ffffffffffffff18;
  _Storage<double,_true> in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff29;
  undefined7 in_stack_ffffffffffffff30;
  byte bVar6;
  char *pcVar7;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
  local_a8 [3];
  bitmask<slang::CommandLineFlags> local_8c;
  pointer local_88;
  size_type sStack_80;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> local_78
  ;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  
  splitMem_00 = (SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)
                &stack0x00000008;
  local_28 = in_RDX;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>::SmallVector
            ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)0x3f20b8);
  local_88 = (splitMem_00->
             super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>).data_;
  sStack_80 = (splitMem_00->
              super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>).len;
  sVar3 = in_RSI + 0x88;
  this_00 = &local_8c;
  bitmask<slang::CommandLineFlags>::bitmask(this_00,CommaList);
  uVar2 = (undefined1)((ulong)in_RSI >> 0x38);
  bitmask<slang::CommandLineFlags>::has
            ((bitmask<slang::CommandLineFlags> *)in_stack_fffffffffffffe90,
             (bitmask<slang::CommandLineFlags> *)in_stack_fffffffffffffe88);
  value_00._M_str = (char *)this_00;
  value_00._M_len = sVar3;
  local_78 = parseList(value_00,(bool)uVar2,splitMem_00);
  local_68 = &local_78;
  local_a8[0]._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
       begin(in_stack_fffffffffffffe88);
  std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
  end((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> *)
      CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                      ((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffe88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
             ::operator*(local_a8);
    pcVar7 = (char *)pbVar4->_M_len;
    bVar6 = 0;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffea0);
    name_00._M_len._7_1_ = bVar6;
    name_00._M_len._0_7_ = in_stack_ffffffffffffff30;
    name_00._M_str = pcVar7;
    value_01._M_str._0_1_ = in_stack_ffffffffffffff28;
    value_01._M_len = (size_t)in_stack_ffffffffffffff20;
    value_01._M_str._1_7_ = in_stack_ffffffffffffff29;
    oVar5 = parseDouble(name_00,value_01,in_stack_ffffffffffffff18);
    uVar2 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_engaged;
    in_stack_fffffffffffffea0 =
         oVar5.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>._M_payload;
    in_stack_ffffffffffffff20 = in_stack_fffffffffffffea0;
    in_stack_ffffffffffffff28 = uVar2;
    bVar1 = std::optional::operator_cast_to_bool((optional<double> *)0x3f2239);
    if (bVar1) {
      in_stack_fffffffffffffe90 = local_28;
      std::optional<double>::operator*((optional<double> *)0x3f22a5);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0,
                 (value_type_conflict6 *)CONCAT17(uVar2,in_stack_fffffffffffffe98));
    }
    else {
      bVar6 = 1;
    }
    if ((bVar6 & 1) == 0) {
      std::__cxx11::string::~string(in_stack_fffffffffffffe90);
    }
    if (!bVar1) goto LAB_003f2300;
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
    ::operator++(local_a8);
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0);
LAB_003f2300:
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>::~SmallVector
            ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)0x3f230d);
  return in_RDI;
}

Assistant:

std::string CommandLine::Option::set(std::vector<double>& target, std::string_view name,
                                     std::string_view value) {
    SmallVector<std::string_view> splitMem;
    for (auto entry : parseList(value, flags.has(CommandLineFlags::CommaList), splitMem)) {
        std::string error;
        auto result = parseDouble(name, entry, error);
        if (!result)
            return error;

        target.push_back(*result);
    }
    return {};
}